

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_column_data.cpp
# Opt level: O3

void duckdb::PartitionedColumnData::BuildPartitionSel<true>
               (PartitionedColumnDataAppendState *state,idx_t append_count)

{
  fixed_size_map_t<duckdb::list_entry_t> *this;
  idx_t *piVar1;
  byte *pbVar2;
  long *plVar3;
  VectorType VVar4;
  ulong *puVar5;
  ulong uVar6;
  uchar *puVar7;
  _Head_base<0UL,_duckdb::list_entry_t_*,_false> _Var8;
  idx_t iVar9;
  InternalException *this_00;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  iterator it;
  string local_50;
  
  this = &state->fixed_partition_entries;
  fixed_size_map_t<duckdb::list_entry_t>::clear(this);
  puVar5 = (ulong *)(state->partition_indices).data;
  VVar4 = (state->partition_indices).vector_type;
  if (VVar4 == CONSTANT_VECTOR) {
    puVar7 = (state->fixed_partition_entries).occupied.validity_mask;
    piVar1 = &(state->fixed_partition_entries).count;
    *piVar1 = (*piVar1 + 1) - (ulong)((puVar7[*puVar5 >> 3] >> ((uint)*puVar5 & 7) & 1) != 0);
    pbVar2 = puVar7 + (*puVar5 >> 3);
    *pbVar2 = *pbVar2 | '\x01' << ((byte)*puVar5 & 7);
    uVar6 = *puVar5;
    _Var8._M_head_impl =
         (state->fixed_partition_entries).values.
         super_unique_ptr<duckdb::list_entry_t[],_std::default_delete<duckdb::list_entry_t[]>_>._M_t
         .super___uniq_ptr_impl<duckdb::list_entry_t,_std::default_delete<duckdb::list_entry_t[]>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::list_entry_t_*,_std::default_delete<duckdb::list_entry_t[]>_>
         .super__Head_base<0UL,_duckdb::list_entry_t_*,_false>._M_head_impl;
    _Var8._M_head_impl[uVar6].offset = 0;
    *(idx_t *)((long)(_Var8._M_head_impl + uVar6) + 8) = append_count;
  }
  else {
    if (VVar4 != FLAT_VECTOR) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Unexpected VectorType in PartitionedTupleData::Append","");
      InternalException::InternalException(this_00,&local_50);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (append_count != 0) {
      iVar9 = 0;
      do {
        uVar6 = puVar5[iVar9];
        uVar10 = (state->fixed_partition_entries).capacity;
        puVar7 = (state->fixed_partition_entries).occupied.validity_mask;
        uVar15 = uVar10 >> 3;
        uVar13 = (uint)uVar10;
        uVar12 = 1 << ((byte)uVar6 & 7) & (uint)puVar7[uVar6 >> 3];
        uVar10 = uVar15;
        uVar14 = uVar13;
        if (uVar12 != 0) {
          uVar14 = (uint)uVar6;
          uVar10 = uVar6 >> 3;
        }
        if ((uVar10 == uVar15) && ((uVar14 & 7) == (uVar13 & 7))) {
          piVar1 = &(state->fixed_partition_entries).count;
          *piVar1 = *piVar1 + (ulong)(uVar12 == 0);
          pbVar2 = puVar7 + (puVar5[iVar9] >> 3);
          *pbVar2 = *pbVar2 | '\x01' << ((byte)puVar5[iVar9] & 7);
          uVar6 = puVar5[iVar9];
          _Var8._M_head_impl =
               (state->fixed_partition_entries).values.
               super_unique_ptr<duckdb::list_entry_t[],_std::default_delete<duckdb::list_entry_t[]>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::list_entry_t,_std::default_delete<duckdb::list_entry_t[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::list_entry_t_*,_std::default_delete<duckdb::list_entry_t[]>_>
               .super__Head_base<0UL,_duckdb::list_entry_t_*,_false>._M_head_impl;
          _Var8._M_head_impl[uVar6].offset = 0;
          *(uint64_t *)((long)(_Var8._M_head_impl + uVar6) + 8) = 1;
        }
        else {
          plVar3 = (long *)((long)((state->fixed_partition_entries).values.
                                   super_unique_ptr<duckdb::list_entry_t[],_std::default_delete<duckdb::list_entry_t[]>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::list_entry_t,_std::default_delete<duckdb::list_entry_t[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::list_entry_t_*,_std::default_delete<duckdb::list_entry_t[]>_>
                                   .super__Head_base<0UL,_duckdb::list_entry_t_*,_false>.
                                   _M_head_impl + uVar10 * 8) + 8U + (ulong)((uVar14 & 7) << 4));
          *plVar3 = *plVar3 + 1;
        }
        iVar9 = iVar9 + 1;
      } while (append_count != iVar9);
    }
  }
  if ((state->fixed_partition_entries).count != 1) {
    local_50._M_string_length = 0;
    local_50.field_2._M_allocated_capacity = 0;
    local_50._M_dataplus._M_p = (pointer)this;
    if ((*(state->fixed_partition_entries).occupied.validity_mask & 1) == 0) {
      fixed_size_map_iterator<duckdb::list_entry_t,_false>::operator++
                ((fixed_size_map_iterator<duckdb::list_entry_t,_false> *)&local_50);
    }
    if (((uint)this->capacity & 7) != local_50.field_2._M_allocated_capacity ||
        this->capacity >> 3 != local_50._M_string_length) {
      lVar11 = 0;
      do {
        _Var8._M_head_impl =
             (((unsafe_unique_array<mapped_type> *)(local_50._M_dataplus._M_p + 0x30))->
             super_unique_ptr<duckdb::list_entry_t[],_std::default_delete<duckdb::list_entry_t[]>_>)
             ._M_t.
             super___uniq_ptr_impl<duckdb::list_entry_t,_std::default_delete<duckdb::list_entry_t[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::list_entry_t_*,_std::default_delete<duckdb::list_entry_t[]>_>
             .super__Head_base<0UL,_duckdb::list_entry_t_*,_false>._M_head_impl;
        _Var8._M_head_impl[local_50._M_string_length * 8 + local_50.field_2._0_8_].offset = lVar11;
        lVar11 = lVar11 + *(long *)((long)(_Var8._M_head_impl +
                                          local_50._M_string_length * 8 + local_50.field_2._0_8_) +
                                   8);
        fixed_size_map_iterator<duckdb::list_entry_t,_false>::operator++
                  ((fixed_size_map_iterator<duckdb::list_entry_t,_false> *)&local_50);
      } while (((uint)this->capacity & 7) != local_50.field_2._M_allocated_capacity ||
               this->capacity >> 3 != local_50._M_string_length);
    }
    if (append_count != 0) {
      iVar9 = 0;
      do {
        puVar7 = (state->fixed_partition_entries).occupied.validity_mask;
        piVar1 = &(state->fixed_partition_entries).count;
        *piVar1 = (*piVar1 + 1) -
                  (ulong)((puVar7[puVar5[iVar9] >> 3] >> ((uint)puVar5[iVar9] & 7) & 1) != 0);
        pbVar2 = puVar7 + (puVar5[iVar9] >> 3);
        *pbVar2 = *pbVar2 | '\x01' << ((byte)puVar5[iVar9] & 7);
        _Var8._M_head_impl =
             (state->fixed_partition_entries).values.
             super_unique_ptr<duckdb::list_entry_t[],_std::default_delete<duckdb::list_entry_t[]>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::list_entry_t,_std::default_delete<duckdb::list_entry_t[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::list_entry_t_*,_std::default_delete<duckdb::list_entry_t[]>_>
             .super__Head_base<0UL,_duckdb::list_entry_t_*,_false>._M_head_impl;
        lVar11 = _Var8._M_head_impl[puVar5[iVar9]].offset;
        _Var8._M_head_impl[puVar5[iVar9]].offset = lVar11 + 1;
        (state->partition_sel).sel_vector[lVar11] = (sel_t)iVar9;
        iVar9 = iVar9 + 1;
      } while (append_count != iVar9);
    }
  }
  return;
}

Assistant:

void PartitionedColumnData::BuildPartitionSel(PartitionedColumnDataAppendState &state, const idx_t append_count) {
	using GETTER = TemplatedMapGetter<list_entry_t, fixed>;
	auto &partition_entries = state.GetMap<fixed>();
	partition_entries.clear();
	const auto partition_indices = FlatVector::GetData<idx_t>(state.partition_indices);
	switch (state.partition_indices.GetVectorType()) {
	case VectorType::FLAT_VECTOR:
		for (idx_t i = 0; i < append_count; i++) {
			const auto &partition_index = partition_indices[i];
			auto partition_entry = partition_entries.find(partition_index);
			if (partition_entry == partition_entries.end()) {
				partition_entries[partition_index] = list_entry_t(0, 1);
			} else {
				GETTER::GetValue(partition_entry).length++;
			}
		}
		break;
	case VectorType::CONSTANT_VECTOR:
		partition_entries[partition_indices[0]] = list_entry_t(0, append_count);
		break;
	default:
		throw InternalException("Unexpected VectorType in PartitionedTupleData::Append");
	}

	// Early out: check if everything belongs to a single partition
	if (partition_entries.size() == 1) {
		return;
	}

	// Compute offsets from the counts
	idx_t offset = 0;
	for (auto it = partition_entries.begin(); it != partition_entries.end(); ++it) {
		auto &partition_entry = GETTER::GetValue(it);
		partition_entry.offset = offset;
		offset += partition_entry.length;
	}

	// Now initialize a single selection vector that acts as a selection vector for every partition
	auto &partition_sel = state.partition_sel;
	for (idx_t i = 0; i < append_count; i++) {
		const auto &partition_index = partition_indices[i];
		auto &partition_offset = partition_entries[partition_index].offset;
		partition_sel[partition_offset++] = UnsafeNumericCast<sel_t>(i);
	}
}